

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O1

void proto3_unittest::TestOneof2::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  Nonnull<const_char_*> pcVar4;
  
  if (from_msg == to_msg) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 != (Nonnull<const_char_*>)0x0) {
    MergeImpl();
  }
  iVar1 = (int)from_msg[1]._internal_metadata_.ptr_;
  if (iVar1 != 0) {
    iVar2 = (int)to_msg[1]._internal_metadata_.ptr_;
    if (iVar2 != iVar1) {
      if (iVar2 != 0) {
        *(undefined4 *)&to_msg[1]._internal_metadata_.ptr_ = 0;
      }
      *(int *)&to_msg[1]._internal_metadata_.ptr_ = iVar1;
    }
    if (iVar1 == 6) {
      *(undefined4 *)&to_msg[1]._vptr_MessageLite = *(undefined4 *)&from_msg[1]._vptr_MessageLite;
    }
  }
  uVar3 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar3 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestOneof2::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestOneof2*>(&to_msg);
  auto& from = static_cast<const TestOneof2&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_unittest.TestOneof2)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_foo();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kFooEnum: {
        _this->_impl_.foo_.foo_enum_ = from._impl_.foo_.foo_enum_;
        break;
      }
      case FOO_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}